

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O0

void Commands::do_punishment
               (Command_Source *from,Character *victim,
               function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *f,bool announce)

{
  Character *pCVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  I18N *pIVar5;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50;
  World *local_30;
  World *world;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *pfStack_20;
  bool announce_local;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *f_local;
  Character *victim_local;
  Command_Source *from_local;
  
  world._7_1_ = announce;
  pfStack_20 = f;
  f_local = (function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *)victim;
  victim_local = (Character *)from;
  iVar3 = (*from->_vptr_Command_Source[4])();
  pCVar1 = victim_local;
  local_30 = (World *)CONCAT44(extraout_var,iVar3);
  if ((f_local == (function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *)0x0) ||
     (((f_local->super__Function_base)._M_functor._M_pod_data[0xd] & 1U) != 0)) {
    pIVar5 = &local_30->i18n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"character_not_found",&local_71);
    I18N::Format<>(&local_50,pIVar5,&local_70);
    (*(pCVar1->super_Command_Source)._vptr_Command_Source[5])(pCVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    bVar2 = (*(code *)**(undefined8 **)&(f_local->super__Function_base)._M_functor)();
    uVar4 = (**(victim_local->super_Command_Source)._vptr_Command_Source)();
    pCVar1 = victim_local;
    if ((uint)bVar2 < (uVar4 & 0xff)) {
      std::function<void_(World_*,_Command_Source_*,_Character_*,_bool)>::operator()
                (f,local_30,&victim_local->super_Command_Source,(Character *)f_local,
                 (bool)(world._7_1_ & 1));
    }
    else {
      pIVar5 = &local_30->i18n;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"command_access_denied",&local_c9);
      I18N::Format<>(&local_a8,pIVar5,&local_c8);
      (*(pCVar1->super_Command_Source)._vptr_Command_Source[5])(pCVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
  }
  return;
}

Assistant:

static void do_punishment(Command_Source* from, Character* victim, std::function<void(World*, Command_Source*, Character*, bool)> f, bool announce)
{
	World* world = from->SourceWorld();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < from->SourceAccess())
		{
			f(world, from, victim, announce);
		}
		else
		{
			from->ServerMsg(world->i18n.Format("command_access_denied"));
		}
	}
}